

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseConnectionPoint(StructuralParser *this)

{
  bool bVar1;
  QualifiedIdentifier *args_00;
  Expression *pEVar2;
  CommaSeparatedList *pCVar3;
  bool local_d1;
  pool_ref<soul::AST::Expression> local_d0;
  pool_ptr<soul::AST::CommaSeparatedList> local_c8;
  pool_ptr<soul::AST::Expression> local_c0;
  pool_ptr<soul::AST::CommaSeparatedList> local_b8;
  undefined1 local_b0 [8];
  pool_ptr<soul::AST::Expression> specialisationArgs;
  pool_ptr<soul::AST::CommaSeparatedList> args;
  QualifiedIdentifier *processorName;
  char *local_60;
  UTF8Reader local_58;
  uint local_50;
  undefined1 local_40 [8];
  pool_ptr<soul::AST::Expression> e;
  UTF8Reader startPos;
  Context errorPos;
  StructuralParser *this_local;
  
  getContext((Context *)&startPos,this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::getCurrentTokeniserPosition
            ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              *)&e);
  tryToParseExpressionIgnoringErrors((StructuralParser *)local_40);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_40);
  if (bVar1) {
    this_local = (StructuralParser *)
                 pool_ptr<soul::AST::Expression>::operator*
                           ((pool_ptr<soul::AST::Expression> *)local_40);
  }
  local_50 = (uint)bVar1;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_40);
  if (local_50 == 0) {
    UTF8Reader::UTF8Reader(&local_58,(UTF8Reader *)&e);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::resetPosition(&this->super_SOULTokeniser,&local_58);
    local_60 = "$identifier";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"$identifier");
    if (!bVar1) {
      Errors::expectedProcessorOrEndpoint<>();
      AST::Context::throwError((Context *)&startPos,(CompileMessage *)&processorName,false);
    }
    args_00 = parseQualifiedIdentifier(this);
    pool_ptr<soul::AST::CommaSeparatedList>::pool_ptr
              ((pool_ptr<soul::AST::CommaSeparatedList> *)&specialisationArgs);
    parseSpecialisationArgs((StructuralParser *)local_b0);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_b0);
    if (bVar1) {
      local_c0.object = (Expression *)local_b0;
      cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_b8,&local_c0);
      specialisationArgs.object = &(local_b8.object)->super_Expression;
      pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_b8);
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_c0);
      bVar1 = pool_ptr<soul::AST::CommaSeparatedList>::operator==
                        ((pool_ptr<soul::AST::CommaSeparatedList> *)&specialisationArgs,(void *)0x0)
      ;
      if (bVar1) {
        pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)local_b0);
        pCVar3 = allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (this,&(pEVar2->super_Statement).super_ASTObject.context);
        pool_ptr<soul::AST::CommaSeparatedList>::pool_ptr<soul::AST::CommaSeparatedList,void>
                  (&local_c8,pCVar3);
        specialisationArgs.object = &(local_c8.object)->super_Expression;
        pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_c8);
        pCVar3 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                           ((pool_ptr<soul::AST::CommaSeparatedList> *)&specialisationArgs);
        pEVar2 = pool_ptr<soul::AST::Expression>::operator*
                           ((pool_ptr<soul::AST::Expression> *)local_b0);
        pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_d0,pEVar2);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar3->items,&local_d0);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_d0);
      }
    }
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_b0);
    local_d1 = false;
    this_local = (StructuralParser *)
                 allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
                           (this,args_00,
                            (pool_ptr<soul::AST::CommaSeparatedList> *)&specialisationArgs,&local_d1
                           );
    local_50 = 1;
    pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr
              ((pool_ptr<soul::AST::CommaSeparatedList> *)&specialisationArgs);
  }
  AST::Context::~Context((Context *)&startPos);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseConnectionPoint()
    {
        auto errorPos = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (auto e = tryToParseExpressionIgnoringErrors())
            return *e;

        resetPosition (startPos);

        if (! matches (Token::identifier))
            errorPos.throwError (Errors::expectedProcessorOrEndpoint());

        auto& processorName = parseQualifiedIdentifier();
        pool_ptr<AST::CommaSeparatedList> args;

        if (auto specialisationArgs = parseSpecialisationArgs())
        {
            args = cast<AST::CommaSeparatedList> (specialisationArgs);

            if (args == nullptr)
            {
                args = allocate<AST::CommaSeparatedList> (specialisationArgs->context);
                args->items.push_back (*specialisationArgs);
            }
        }

        return allocate<AST::CallOrCast> (processorName, args, false);
    }